

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

GetIndexDataStruct *
cfd::js::api::ElementsTransactionStructApi::GetTxOutIndex
          (GetIndexDataStruct *__return_storage_ptr__,GetTxOutIndexRequestStruct *request)

{
  GetTxOutIndexRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetTxOutIndexRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetTxOutIndexRequestStruct *request_local;
  GetIndexDataStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  GetIndexDataStruct::GetIndexDataStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>::
  function<cfd::js::api::ElementsTransactionStructApi::GetTxOutIndex(cfd::js::api::GetTxOutIndexRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxOutIndexRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetTxOutIndex",&local_129);
  ExecuteStructApi<cfd::js::api::GetTxOutIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            ((GetIndexDataStruct *)(local_108 + 0x20),(api *)this,
             (GetTxOutIndexRequestStruct *)local_108,&local_128,in_R8);
  GetIndexDataStruct::operator=(__return_storage_ptr__,(GetIndexDataStruct *)(local_108 + 0x20));
  GetIndexDataStruct::~GetIndexDataStruct((GetIndexDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  ::~function((function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

GetIndexDataStruct ElementsTransactionStructApi::GetTxOutIndex(
    const GetTxOutIndexRequestStruct& request) {
  auto call_func = [](const GetTxOutIndexRequestStruct& request)
      -> GetIndexDataStruct {  // NOLINT
    GetIndexDataStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    if (!request.address.empty()) {
      ElementsAddressFactory address_factory;
      if (ElementsConfidentialAddress::IsConfidentialAddress(
              request.address)) {
        ElementsConfidentialAddress confidential_addr(request.address);
        ctx.IsFindTxOut(
            confidential_addr.GetUnblindedAddress(), &response.index,
            &response.indexes);
      } else {
        ctx.IsFindTxOut(
            address_factory.GetAddress(request.address), &response.index,
            &response.indexes);
      }
    } else {
      ctx.IsFindTxOut(
          Script(request.direct_locking_script), &response.index,
          &response.indexes);
    }
    if (response.indexes.empty()) {
      warn(CFD_LOG_SOURCE, "target is not found.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "target is not found.");
    }
    return response;
  };

  GetIndexDataStruct result;
  result = ExecuteStructApi<GetTxOutIndexRequestStruct, GetIndexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}